

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::NewLiteral(Rune rune,ParseFlags flags)

{
  Regexp *this;
  Regexp *re;
  ParseFlags flags_local;
  Rune rune_local;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,kRegexpLiteral,flags);
  (this->field_7).rune_ = rune;
  return this;
}

Assistant:

Regexp* Regexp::NewLiteral(Rune rune, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpLiteral, flags);
  re->rune_ = rune;
  return re;
}